

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

App_p __thiscall CLI::App::get_subcommand_ptr(App *this,string *subcom)

{
  bool bVar1;
  element_type *this_00;
  OptionNotFound *this_01;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  App_p AVar2;
  string local_90;
  string local_60;
  __shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_40;
  App_p *subcomptr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *__range1;
  string *subcom_local;
  App *this_local;
  
  __end1 = std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>::
           begin((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_> *)
                 (subcom + 0x16));
  subcomptr = (App_p *)std::
                       vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                       ::end((vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                              *)(subcom + 0x16));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
                                *)&subcomptr);
    if (!bVar1) {
      this_01 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_90,in_RDX);
      OptionNotFound::OptionNotFound(this_01,&local_90);
      __cxa_throw(this_01,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
    }
    local_40 = (__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
               ::operator*(&__end1);
    this_00 = std::__shared_ptr_access<CLI::App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(local_40);
    ::std::__cxx11::string::string((string *)&local_60,in_RDX);
    bVar1 = check_name(this_00,&local_60);
    ::std::__cxx11::string::~string((string *)&local_60);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<CLI::App>_*,_std::vector<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>_>
    ::operator++(&__end1);
  }
  std::shared_ptr<CLI::App>::shared_ptr
            ((shared_ptr<CLI::App> *)this,(shared_ptr<CLI::App> *)local_40);
  AVar2.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  AVar2.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (App_p)AVar2.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE CLI::App_p App::get_subcommand_ptr(std::string subcom) const {
    for(const App_p &subcomptr : subcommands_)
        if(subcomptr->check_name(subcom))
            return subcomptr;
    throw OptionNotFound(subcom);
}